

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O2

QDebug operator<<(QDebug d,QGestureEvent *gestureEvent)

{
  QDebug debug;
  long lVar1;
  undefined8 uVar2;
  QDebug *pQVar3;
  long in_RDX;
  long in_FS_OFFSET;
  QArrayDataPointer<QGesture_*> local_60;
  undefined1 local_48 [16];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)gestureEvent);
  *(undefined1 *)(*(long *)gestureEvent + 0x30) = 0;
  pQVar3 = QDebug::operator<<((QDebug *)gestureEvent,"QGestureEvent(");
  local_48._0_8_ = pQVar3->stream;
  *(int *)(local_48._0_8_ + 0x28) = *(int *)(local_48._0_8_ + 0x28) + 1;
  local_60.d = *(Data **)(in_RDX + 0x10);
  local_60.ptr = *(QGesture ***)(in_RDX + 0x18);
  local_60.size = *(qsizetype *)(in_RDX + 0x20);
  if (local_60.d != (Data *)0x0) {
    LOCK();
    ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  debug.stream = (Stream *)(local_48 + 8);
  operator<<(debug,(QList<QGesture_*> *)local_48);
  QDebug::operator<<((QDebug *)debug.stream,')');
  QDebug::~QDebug((QDebug *)debug.stream);
  QArrayDataPointer<QGesture_*>::~QArrayDataPointer(&local_60);
  QDebug::~QDebug((QDebug *)local_48);
  uVar2 = *(undefined8 *)gestureEvent;
  *(undefined8 *)gestureEvent = 0;
  *(undefined8 *)d.stream = uVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)d.stream;
  }
  __stack_chk_fail();
}

Assistant:

Q_WIDGETS_EXPORT QDebug operator<<(QDebug d, const QGestureEvent *gestureEvent)
{
    QDebugStateSaver saver(d);
    d.nospace();
    d << "QGestureEvent(" << gestureEvent->gestures() << ')';
    return d;
}